

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_tree.cpp
# Opt level: O1

void __thiscall
HuffTree::add_code(HuffTree *this,char data,vector<bool,_std::allocator<bool>_> *code)

{
  TreeNode *pTVar1;
  undefined4 *puVar2;
  uint uVar3;
  long lVar4;
  default_delete<HuffTree::TreeNode> *this_00;
  undefined7 in_register_00000031;
  ulong *puVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong *puVar9;
  TreeNode *local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined8 uStack_50;
  uint local_40;
  undefined4 local_3c;
  ulong *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000031,data);
  this->curr_node =
       (this->root)._M_t.
       super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
       super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
       super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl;
  puVar9 = (code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  puVar5 = (code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar6 = (code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  if (uVar6 != 0 || puVar9 != puVar5) {
    uVar8 = 0;
    local_40 = uVar6;
    local_38 = puVar5;
    do {
      pTVar1 = this->curr_node;
      if ((*puVar9 >> (uVar8 & 0x3f) & 1) == 0) {
        lVar4 = 8;
        if ((pTVar1->_left)._M_t.
            super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t
            .super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
            super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl == (TreeNode *)0x0) {
          pTVar1->_is_leaf = false;
          local_68 = 0x20;
          uStack_64 = 0;
          uStack_60 = 0;
          uStack_5c = 0;
          local_58 = 0;
          uStack_54 = 0;
          uStack_50 = 1;
          puVar2 = (undefined4 *)operator_new(0x20);
          this_00 = (default_delete<HuffTree::TreeNode> *)&pTVar1->_left;
          goto LAB_00106c6f;
        }
      }
      else {
        lVar4 = 0x10;
        if ((pTVar1->_right)._M_t.
            super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t
            .super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
            super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl == (TreeNode *)0x0) {
          pTVar1->_is_leaf = false;
          local_68 = 0x20;
          uStack_64 = 0;
          uStack_60 = 0;
          uStack_5c = 0;
          local_58 = 0;
          uStack_54 = 0;
          uStack_50 = 1;
          puVar2 = (undefined4 *)operator_new(0x20);
          this_00 = (default_delete<HuffTree::TreeNode> *)&pTVar1->_right;
LAB_00106c6f:
          *puVar2 = local_68;
          puVar2[1] = uStack_64;
          puVar2[2] = uStack_60;
          puVar2[3] = uStack_5c;
          uStack_60 = 0;
          uStack_5c = 0;
          *(ulong *)(puVar2 + 4) = CONCAT44(uStack_54,local_58);
          local_58 = 0;
          uStack_54 = 0;
          *(undefined1 *)(puVar2 + 6) = 1;
          local_70 = (TreeNode *)0x0;
          pTVar1 = *(TreeNode **)this_00;
          *(undefined4 **)this_00 = puVar2;
          if (pTVar1 != (TreeNode *)0x0) {
            std::default_delete<HuffTree::TreeNode>::operator()(this_00,pTVar1);
          }
          if (local_70 != (TreeNode *)0x0) {
            std::default_delete<HuffTree::TreeNode>::operator()
                      ((default_delete<HuffTree::TreeNode> *)&local_70,local_70);
          }
          local_70 = (TreeNode *)0x0;
          if ((TreeNode *)CONCAT44(uStack_54,local_58) != (TreeNode *)0x0) {
            std::default_delete<HuffTree::TreeNode>::operator()
                      ((default_delete<HuffTree::TreeNode> *)&local_58,
                       (TreeNode *)CONCAT44(uStack_54,local_58));
          }
          local_58 = 0;
          uStack_54 = 0;
          puVar5 = local_38;
          uVar6 = local_40;
          if ((TreeNode *)CONCAT44(uStack_5c,uStack_60) != (TreeNode *)0x0) {
            std::default_delete<HuffTree::TreeNode>::operator()
                      ((default_delete<HuffTree::TreeNode> *)&uStack_60,
                       (TreeNode *)CONCAT44(uStack_5c,uStack_60));
            puVar5 = local_38;
            uVar6 = local_40;
          }
        }
      }
      this->curr_node = *(TreeNode **)(&this->curr_node->_data + lVar4);
      iVar7 = (int)uVar8;
      puVar9 = puVar9 + (iVar7 == 0x3f);
      uVar3 = iVar7 + 1;
      if (iVar7 == 0x3f) {
        uVar3 = 0;
      }
      uVar8 = (ulong)uVar3;
    } while (uVar3 != uVar6 || puVar9 != puVar5);
  }
  pTVar1 = this->curr_node;
  pTVar1->_data = (char)local_3c;
  pTVar1->_is_leaf = true;
  return;
}

Assistant:

void HuffTree::add_code(char data, std::vector<bool> code) {
    back_to_root();
    for (bool bit : code) {
        if (bit) {
            if (!curr_node->_right) {
                curr_node->_is_leaf = false;
                curr_node->_right = std::make_unique<TreeNode>(TreeNode());
            }
            curr_node = curr_node->_right.get();
        } else {
            if (!curr_node->_left) {
                curr_node->_is_leaf = false;
                curr_node->_left = std::make_unique<TreeNode>(TreeNode());
            }
            curr_node = curr_node->_left.get();
        }
    }
    curr_node->_data = data;
    curr_node->_is_leaf = true;
}